

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11EglPlatform.cpp
# Opt level: O1

NativeDisplay * __thiscall
tcu::x11::egl::DisplayFactory::createDisplay(DisplayFactory *this,EGLAttrib *attribList)

{
  XlibDisplay *this_00;
  Display *this_01;
  MovePtr<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_> local_28;
  
  this_00 = (XlibDisplay *)operator_new(0x20);
  XlibDisplay::XlibDisplay(this_00,this->m_eventState,(char *)0x0);
  this_01 = (Display *)operator_new(0x228);
  local_28.super_UniqueBase<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_>.
  m_data.ptr = this_00;
  Display::Display(this_01,&local_28);
  if (local_28.super_UniqueBase<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_>.
      m_data.ptr != (XlibDisplay *)0x0) {
    (*((local_28.super_UniqueBase<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_>
        .m_data.ptr)->super_DisplayBase)._vptr_DisplayBase[1])();
  }
  return &this_01->super_NativeDisplay;
}

Assistant:

NativeDisplay* DisplayFactory::createDisplay (const eglw::EGLAttrib* attribList) const
{
	DE_UNREF(attribList);

	//! \todo [2014-03-18 lauri] Somehow make the display configurable from command line
	MovePtr<XlibDisplay>	x11Display	(new XlibDisplay(m_eventState, DE_NULL));

	return new Display(x11Display);
}